

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_cursor_tests.cpp
# Opt level: O0

void msgpack_stream_cursor_reset_test_traits::set_input
               (input_type *input,vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  uchar *puVar1;
  size_type sVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  string *in_RDI;
  string s;
  char *data;
  allocator local_39;
  string local_38 [32];
  uchar *local_18;
  string *local_8;
  
  local_8 = in_RDI;
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x9316a3);
  local_18 = puVar1;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,(char *)puVar1,sVar2,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::istringstream::str(local_8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

static void set_input(input_type& input, std::vector<uint8_t> bytes)
    {
        auto data = reinterpret_cast<const char*>(bytes.data());
        std::string s(data, bytes.size());
        input.str(s);
    }